

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

YieldResult * __thiscall
NEST::NESTcalc::GetYieldNROld
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,int option)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_68;
  YieldResult result;
  double FakeField;
  double Nph;
  double Ne;
  int option_local;
  double energy_local;
  NESTcalc *this_local;
  
  if (option == 0) {
    result.DeltaT_Scint = 1.0;
    dVar1 = pow(energy,1.3483);
    dVar2 = pow(energy,1.3875);
    dVar2 = log(dVar2 * 0.84074 + 1.0);
    dVar3 = pow(energy,1.3875);
    FakeField = energy * 60.8 * dVar1 * 0.050295 * (dVar2 / (dVar3 * 0.84074));
    dVar1 = pow(energy,0.16199);
    dVar2 = pow(energy,1.088);
    dVar2 = log(dVar2 * 0.74533 + 1.0);
    dVar3 = pow(energy,1.088);
    Nph = energy * (dVar1 * 10.661 * (dVar2 / (dVar3 * 0.74533)) + 0.93739);
  }
  else if (option == 1) {
    result.DeltaT_Scint = 200.0;
    dVar1 = pow(energy,0.13816);
    dVar2 = pow(energy,1.1388);
    dVar2 = log(dVar2 * 0.040945 + 1.0);
    dVar3 = pow(energy,1.1388);
    Nph = energy * dVar1 * 4.1395 * (dVar2 / (dVar3 * 0.040945));
    dVar1 = pow(energy,0.29222);
    FakeField = energy * 3.35 * dVar1;
  }
  else if (option == 2) {
    result.DeltaT_Scint = 730.0;
    dVar1 = pow(energy / 385.46,1.2669);
    FakeField = -7583.6728 / (dVar1 + 1.0) + 7582.3;
    dVar1 = pow(energy,0.3222);
    dVar2 = pow(energy,0.65729);
    dVar2 = exp(dVar2 * -0.12684);
    Nph = dVar1 * 60.914 * (1.0 - dVar2);
  }
  else {
    result.DeltaT_Scint = 180.0;
    dVar1 = pow(energy,0.73502);
    dVar2 = exp(energy * -0.0034329);
    Nph = (dVar1 * 12.372 + -3.878) * dVar2;
    dVar1 = pow(energy,1.3018);
    FakeField = dVar1 * 3.8584 + 0.81704;
  }
  memset(&local_68,0,0x30);
  if (FakeField < 0.0) {
    FakeField = 0.0;
  }
  if (Nph < 0.0) {
    Nph = 0.0;
  }
  local_68 = FakeField;
  result.PhotonYield = Nph;
  result.ElectronYield = 1.0;
  result.ExcitonRatio = ((FakeField + Nph) / energy) * 13.4 * 0.001;
  result.Lindhard = result.DeltaT_Scint;
  result.ElectricField = -999.0;
  (*this->_vptr_NESTcalc[0xb])(energy,0x402acccccccccccd,__return_storage_ptr__,this,&local_68);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldNROld(
    double energy,
    int option) {  // possible anti-correlation in NR ignored totally

  double Ne, Nph, FakeField;

  if (option == 0) {
    // with old-school L_eff*S_nr conversion, and more explicit Thomas-Imel box
    // model formulae but approximation where Qy can sail off as energy to 0
    FakeField = 1.00;
    Nph = 0.95 * 64. * energy *
          (0.050295 * pow(energy, 1.3483) *
           (log(1. + (0.84074 * pow(energy, 1.3875))) /
            (0.84074 *
             pow(energy,
                 1.3875))));  // NESTv0.97beta (2011) ~0 V/cm arXiv:1106.1613
    Ne = energy * (10.661 * pow(energy, 0.16199) *
                       (log(1. + (0.745330 * pow(energy, 1.0880))) /
                        (0.745330 * pow(energy, 1.0880))) +
                   0.93739);  // essentially Lindhard with k of 0.166
  } else if (option == 1) {
    FakeField = 200.;
    Ne = energy *
         (4.1395 * pow(energy, 0.13816) *
          (log(1. + (0.040945 * pow(energy, 1.1388))) /
           (0.040945 *
            pow(energy,
                1.1388))));  // conservative: k < or ~ to 0.110 (Hitachi-like)
    Nph = energy * 3.35 *
          pow(energy,
              0.29222);  // NESTv0.98 (2013) model for legacy comparisons
                         // (arXiv:1307.6601) using simple power law (optional
                         // constant; optional for Nph)
  } else if (option == 2) {
    FakeField = 730.;
    Nph = 7582.3 +
          (-1.3728 - 7582.3) /
              (1. + pow(energy / 385.46,
                        1.2669));  // NEST v1.0 (2015) arXiv:1412.4417, with
                                   // ability to cut off yield at either low or
                                   // high energy. Fit to Nph
    Ne = (60.914 * pow(energy, 0.32220)) *
         (1. -
          exp(-0.12684 * pow(energy,
                             0.65729)));  // middle of road: k = 0.14. By Brian
                                          // Lenardo, still pre-LUX-DD. With
                                          // explicit bi-Exc quenching
  } else {
    // simplest by far, but not 1st principles: based on work of M. Wyman
    // UAlbany
    FakeField = 180.;  // fit to LUX Run03 D-D alone
    Ne = (-3.8780 + 12.372 * pow(energy, 0.73502)) *
         exp(-0.0034329 *
             energy);  // slide 68 of Matthew's private Google Slides mega-deck
    Nph = 0.81704 + 3.8584 * pow(energy, 1.30180);  // ditto
  }

  YieldResult result{};
  if (Nph < 0.) Nph = 0.;
  if (Ne < 0.) Ne = 0.;
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = 1.;
  result.Lindhard = ((Nph + Ne) / energy) * W_DEFAULT * 1e-3;
  result.ElectricField = FakeField;
  result.DeltaT_Scint = -999.;
  return YieldResultValidity(result, energy, W_DEFAULT);
}